

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O1

void qpCrashHandler_destroy(qpCrashHandler *handler)

{
  sigaction *__act;
  long lVar1;
  
  lVar1 = 0;
  deSetAssertFailureCallback((deAssertFailureCallbackFunc)0x0);
  __act = (sigaction *)handler->oldHandlers;
  do {
    sigaction(*(int *)((long)&s_signals[0].signalNum + lVar1),__act,(sigaction *)0x0);
    __act = __act + 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x60);
  g_crashHandler = (qpCrashHandler *)0x0;
  deFree(handler);
  return;
}

Assistant:

void qpCrashHandler_destroy (qpCrashHandler* handler)
{
	DBGPRINT(("qpCrashHandler::destroy()\n"));

	DE_ASSERT(g_crashHandler == handler);

	deSetAssertFailureCallback(DE_NULL);

#if defined(QP_USE_SIGNAL_HANDLER)
	/* Restore old handlers. */
	{
		int sigNdx;
		for (sigNdx = 0; sigNdx < DE_LENGTH_OF_ARRAY(s_signals); sigNdx++)
			sigaction(s_signals[sigNdx].signalNum, &handler->oldHandlers[sigNdx], DE_NULL);
	}
#endif

	g_crashHandler = DE_NULL;

	deFree(handler);
}